

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O0

fp fmt::v6::internal::get_cached_power(int min_exponent,int *pow10_exponent)

{
  int iVar1;
  int iVar2;
  int *in_RSI;
  int in_EDI;
  fp fVar3;
  int dec_exp_step;
  int first_dec_exp;
  int index;
  int64_t one_over_log2_10;
  undefined1 local_10 [12];
  
  iVar1 = (int)((ulong)((long)(in_EDI + 0x3f) * 0x4d104d42 + 0xffffffff) >> 0x20);
  iVar2 = iVar1 + 0x15b;
  if (iVar2 < 0) {
    iVar2 = iVar1 + 0x162;
  }
  iVar2 = (iVar2 >> 3) + 1;
  *in_RSI = iVar2 * 8 + -0x15c;
  fp::fp((fp *)local_10,*(uint64_t *)(basic_data<void>::pow10_significands + (long)iVar2 * 8),
         (int)*(short *)(basic_data<void>::pow10_exponents + (long)iVar2 * 2));
  fVar3._12_4_ = 0;
  fVar3.f = local_10._0_8_;
  fVar3.e = local_10._8_4_;
  return fVar3;
}

Assistant:

inline fp get_cached_power(int min_exponent, int& pow10_exponent) {
  const int64_t one_over_log2_10 = 0x4d104d42;  // round(pow(2, 32) / log2(10))
  int index = static_cast<int>(
      ((min_exponent + fp::significand_size - 1) * one_over_log2_10 +
       ((int64_t(1) << 32) - 1))  // ceil
      >> 32                       // arithmetic shift
  );
  // Decimal exponent of the first (smallest) cached power of 10.
  const int first_dec_exp = -348;
  // Difference between 2 consecutive decimal exponents in cached powers of 10.
  const int dec_exp_step = 8;
  index = (index - first_dec_exp - 1) / dec_exp_step + 1;
  pow10_exponent = first_dec_exp + index * dec_exp_step;
  return {data::pow10_significands[index], data::pow10_exponents[index]};
}